

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O0

void __thiscall MinVR::VRDataQueue::push(VRDataQueue *this,VRDataIndex *event)

{
  VRDataIndex *index;
  VRDataQueue *in_RSI;
  VRDataIndex *in_stack_00000008;
  VRDataIndex *in_stack_00000010;
  VRDataQueueItem *in_stack_00000040;
  longlong in_stack_00000048;
  VRDataQueue *in_stack_00000050;
  VRDataIndex *eventPtr;
  VRDataQueueItem *in_stack_ffffffffffffffb0;
  
  index = (VRDataIndex *)operator_new(0x98);
  VRDataIndex::VRDataIndex(in_stack_00000010,in_stack_00000008);
  makeTimeStamp(in_RSI);
  VRDataQueueItem::VRDataQueueItem(in_stack_ffffffffffffffb0,index);
  push(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  VRDataQueueItem::~VRDataQueueItem((VRDataQueueItem *)0x160769);
  return;
}

Assistant:

void VRDataQueue::push(const VRDataIndex event) {
  VRDataIndex* eventPtr = new VRDataIndex(event);
  push(makeTimeStamp(), VRDataQueueItem(eventPtr));
}